

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetStep.c
# Opt level: O2

Aig_Obj_t * Saig_ManRetimeNodeFwd(Aig_Man_t *p,Aig_Obj_t *pObj,int fMakeBug)

{
  uint __line;
  int iVar1;
  char *__assertion;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  Aig_Obj_t *pAVar5;
  
  if (p->nRegs < 1) {
    __assertion = "Saig_ManRegNum(p) > 0";
    __line = 0x34;
  }
  else if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assertion = "Aig_ObjIsNode(pObj)";
    __line = 0x35;
  }
  else {
    pAVar2 = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    if (((((*(uint *)&pAVar2->field_0x18 & 7) != 2) ||
         (pAVar5 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),
         (*(uint *)&pAVar5->field_0x18 & 7) != 2)) || (iVar1 = Saig_ObjIsLo(p,pAVar2), iVar1 == 0))
       || (iVar1 = Saig_ObjIsLo(p,pAVar5), iVar1 == 0)) {
      return (Aig_Obj_t *)0x0;
    }
    iVar1 = Aig_ObjCioId(pAVar2);
    if (iVar1 < 1) {
      __assertion = "Aig_ObjCioId(pFanin0) > 0";
      __line = 0x41;
    }
    else {
      iVar1 = Aig_ObjCioId(pAVar5);
      if (0 < iVar1) {
        if ((pAVar2->TravId != p->nTravIds) && (pAVar5->TravId != p->nTravIds)) {
          return (Aig_Obj_t *)0x0;
        }
        iVar1 = Aig_ObjCioId(pAVar2);
        pAVar2 = Saig_ManLi(p,iVar1 - p->nTruePis);
        iVar1 = Aig_ObjCioId(pAVar5);
        pAVar5 = Saig_ManLi(p,iVar1 - p->nTruePis);
        uVar3 = (ulong)((uint)pObj->pFanin0 & 1);
        pAVar2 = pAVar2->pFanin0;
        uVar4 = (ulong)((uint)pObj->pFanin1 & 1);
        pAVar5 = (Aig_Obj_t *)((ulong)pAVar5->pFanin0 ^ uVar4);
        if (fMakeBug != 0) {
          puts("Introducing bug during retiming.");
          pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
        }
        pAVar2 = Aig_And(p,(Aig_Obj_t *)((ulong)pAVar2 ^ uVar3),pAVar5);
        if (uVar3 == 0) {
          uVar4 = 0;
        }
        pAVar2 = Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)pAVar2 ^ uVar4));
        (pAVar2->field_0).CioId = p->nObjs[3] + -1;
        pAVar2 = Aig_ObjCreateCi(p);
        (pAVar2->field_0).CioId = p->nObjs[2] + -1;
        p->nRegs = p->nRegs + 1;
        pAVar2->TravId = p->nTravIds;
        return (Aig_Obj_t *)(uVar4 ^ (ulong)pAVar2);
      }
      __assertion = "Aig_ObjCioId(pFanin1) > 0";
      __line = 0x42;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigRetStep.c"
                ,__line,"Aig_Obj_t *Saig_ManRetimeNodeFwd(Aig_Man_t *, Aig_Obj_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs one retiming step forward.]

  Description [Returns the pointer to the register output after retiming.]
               
  SideEffects [Remember to run Aig_ManSetCioIds() in advance.]

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Saig_ManRetimeNodeFwd( Aig_Man_t * p, Aig_Obj_t * pObj, int fMakeBug )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Aig_Obj_t * pInput0, * pInput1;
    Aig_Obj_t * pObjNew, * pObjLi, * pObjLo;
    int fCompl;

    assert( Saig_ManRegNum(p) > 0 );
    assert( Aig_ObjIsNode(pObj) );

    // get the fanins
    pFanin0 = Aig_ObjFanin0(pObj);
    pFanin1 = Aig_ObjFanin1(pObj);
    // skip of they are not primary inputs
    if ( !Aig_ObjIsCi(pFanin0) || !Aig_ObjIsCi(pFanin1) )
        return NULL;

    // skip of they are not register outputs
    if ( !Saig_ObjIsLo(p, pFanin0) || !Saig_ObjIsLo(p, pFanin1) )
        return NULL;
    assert( Aig_ObjCioId(pFanin0) > 0 );
    assert( Aig_ObjCioId(pFanin1) > 0 );

    // skip latch guns
    if ( !Aig_ObjIsTravIdCurrent(p, pFanin0) && !Aig_ObjIsTravIdCurrent(p, pFanin1) )
        return NULL;

    // get the inputs of these registers
    pInput0 = Saig_ManLi( p, Aig_ObjCioId(pFanin0) - Saig_ManPiNum(p) );
    pInput1 = Saig_ManLi( p, Aig_ObjCioId(pFanin1) - Saig_ManPiNum(p) );
    pInput0 = Aig_ObjChild0( pInput0 );
    pInput1 = Aig_ObjChild0( pInput1 );
    pInput0 = Aig_NotCond( pInput0, Aig_ObjFaninC0(pObj) );
    pInput1 = Aig_NotCond( pInput1, Aig_ObjFaninC1(pObj) );
    // get the condition when the register should be complemetned
    fCompl = Aig_ObjFaninC0(pObj) && Aig_ObjFaninC1(pObj);

    if ( fMakeBug )
    {
        printf( "Introducing bug during retiming.\n" );
        pInput1 = Aig_Not( pInput1 );
    }

    // create new node
    pObjNew = Aig_And( p, pInput0, pInput1 );

    // create new register input
    pObjLi = Aig_ObjCreateCo( p, Aig_NotCond(pObjNew, fCompl) );
    pObjLi->CioId = Aig_ManCoNum(p) - 1;

    // create new register output
    pObjLo = Aig_ObjCreateCi( p );
    pObjLo->CioId = Aig_ManCiNum(p) - 1;
    p->nRegs++;

    // make sure the register is retimable.
    Aig_ObjSetTravIdCurrent(p, pObjLo);

//printf( "Reg = %4d. Reg = %4d. Compl = %d. Phase = %d.\n", 
//       pFanin0->PioNum, pFanin1->PioNum, Aig_IsComplement(pObjNew), fCompl );

    // return register output
    return Aig_NotCond( pObjLo, fCompl );
}